

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O2

void CESkyCoord::Galactic2CIRS(CESkyCoord *in_galactic,CESkyCoord *out_cirs,CEDate *date)

{
  CESkyCoord tmp_icrs;
  CESkyCoord local_50;
  
  CESkyCoord(&local_50);
  Galactic2ICRS(in_galactic,&local_50);
  ICRS2CIRS(&local_50,out_cirs,date);
  ~CESkyCoord(&local_50);
  return;
}

Assistant:

void CESkyCoord::Galactic2CIRS(const CESkyCoord& in_galactic,
                               CESkyCoord*       out_cirs,
                               const CEDate&     date)
{
    // Do the Galactic -> ICRS converstion
    CESkyCoord tmp_icrs;
    Galactic2ICRS(in_galactic, &tmp_icrs);
    
    // Now convert ICRS -> CIRS
    ICRS2CIRS(tmp_icrs, out_cirs, date);
    
    return;
}